

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeLiteGenerator::FindMatchingHeaderfiles
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles)

{
  _Base_ptr filename;
  pointer pbVar1;
  bool bVar2;
  iterator iVar3;
  pointer args;
  string headerBasename;
  string hname;
  char local_a9;
  cmake *local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a8 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
  local_98 = (cFiles->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = &(cFiles->_M_t)._M_impl.super__Rb_tree_header._M_header;
  do {
    if (local_98 == local_a0) {
      return;
    }
    filename = local_98 + 1;
    cmsys::SystemTools::GetFilenamePath(&local_50,(string *)filename);
    local_a9 = '/';
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_70,(string *)filename);
    cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
              (&local_90,&local_50,&local_a9,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pbVar1 = (local_a8->HeaderFileExtensions).ordered.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (args = (local_a8->HeaderFileExtensions).ordered.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; args != pbVar1; args = args + 1) {
      local_70._M_dataplus._M_p._0_1_ = 0x2e;
      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
                (&local_50,&local_90,(char *)&local_70,args);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&otherFiles->_M_t,&local_50);
      if ((_Rb_tree_header *)iVar3._M_node != &(otherFiles->_M_t)._M_impl.super__Rb_tree_header) {
LAB_003e5bf5:
        std::__cxx11::string::~string((string *)&local_50);
        break;
      }
      bVar2 = cmsys::SystemTools::FileExists(&local_50);
      if (bVar2) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)otherFiles,&local_50);
        goto LAB_003e5bf5;
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_90);
    local_98 = (_Base_ptr)std::_Rb_tree_increment(local_98);
  } while( true );
}

Assistant:

void cmExtraCodeLiteGenerator::FindMatchingHeaderfiles(
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles)
{

  const std::vector<std::string>& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the CodeBlocks
  // project generator.
  for (auto const& sit : cFiles) {
    std::string headerBasename =
      cmStrCat(cmSystemTools::GetFilenamePath(sit.first), '/',
               cmSystemTools::GetFilenameWithoutExtension(sit.first));

    // check if there's a matching header around
    for (std::string const& ext : headerExts) {
      std::string hname = cmStrCat(headerBasename, '.', ext);
      // if it's already in the set, don't check if it exists on disk
      auto headerIt = otherFiles.find(hname);
      if (headerIt != otherFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname)) {
        otherFiles.insert(hname);
        break;
      }
    }
  }
}